

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O2

void __thiscall
Equality_componentEqualWithComponentHierarchy_Test::
~Equality_componentEqualWithComponentHierarchy_Test
          (Equality_componentEqualWithComponentHierarchy_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, componentEqualWithComponentHierarchy)
{
    libcellml::ComponentPtr c1 = libcellml::Component::create("c");
    libcellml::ComponentPtr c2 = libcellml::Component::create("c");

    libcellml::ComponentPtr cChild1 = libcellml::Component::create("child1");
    libcellml::ComponentPtr cChild2 = libcellml::Component::create("child1");

    libcellml::ComponentPtr cChild11 = libcellml::Component::create("child11");
    libcellml::ComponentPtr cChild21 = libcellml::Component::create("child11");

    c1->addComponent(cChild1);
    c2->addComponent(cChild2);

    cChild1->addComponent(cChild11);
    cChild2->addComponent(cChild21);

    EXPECT_TRUE(c1->equals(c2));
    EXPECT_TRUE(c2->equals(c1));
}